

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void __thiscall
pdqsort_detail::
sort3<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__0>
          (pdqsort_detail *this,
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          a,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
            b,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
              c,anon_class_16_2_a9e7a8bd comp)

{
  undefined8 uVar1;
  pointer ppVar2;
  double dVar3;
  pointer ppVar4;
  pointer ppVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer ppVar8;
  long lVar9;
  double **ppdVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined4 local_4c;
  undefined4 uStack_48;
  
  ppdVar10 = comp.edgeWt;
  lVar9 = (long)(a._M_current)->basisIndex;
  dVar15 = (c._M_current)->fractionality;
  auVar16._0_8_ = (1.0 - *(double *)this) * *(double *)this;
  auVar16._8_8_ = (1.0 - (a._M_current)->fractionality) * (a._M_current)->fractionality;
  uVar1 = *(undefined8 *)((long)dVar15 + lVar9 * 8);
  auVar17._8_4_ = (int)uVar1;
  auVar17._0_8_ = *(undefined8 *)((long)dVar15 + (long)*(int *)(this + 0x18) * 8);
  auVar17._12_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar17 = divpd(auVar16,auVar17);
  dVar18 = auVar17._8_8_;
  if ((auVar17._0_8_ < dVar18) ||
     ((auVar17._0_8_ <= dVar18 &&
      (uVar14 = (long)*(int *)(this + 0x18) + (long)ppdVar10[3], uVar12 = uVar14 >> 0x20,
      uVar14 = uVar14 & 0xffffffff, uVar11 = (long)ppdVar10[3] + lVar9, uVar13 = uVar11 & 0xffffffff
      , uVar11 = uVar11 >> 0x20,
      ((uVar14 + 0x42d8680e260ae5b) * (uVar12 + 0x8a183895eeac1536) ^
      (uVar12 + 0x80c8963be3e4c2f3) * (uVar14 + 0xc8497d2a400d9551) >> 0x20) <
      ((uVar13 + 0x42d8680e260ae5b) * (uVar11 + 0x8a183895eeac1536) ^
      (uVar11 + 0x80c8963be3e4c2f3) * (uVar13 + 0xc8497d2a400d9551) >> 0x20))))) {
    dVar15 = *(double *)this;
    dVar18 = *(double *)(this + 8);
    uVar1 = *(undefined8 *)(this + 0x14);
    uStack_48 = (undefined4)((ulong)*(undefined8 *)(this + 0xc) >> 0x20);
    local_4c = (undefined4)((ulong)dVar18 >> 0x20);
    ppVar2 = *(pointer *)(this + 0x30);
    ppVar4 = *(pointer *)(this + 0x20);
    ppVar5 = *(pointer *)(this + 0x28);
    *(undefined8 *)(this + 0x20) = 0;
    *(undefined8 *)(this + 0x28) = 0;
    *(undefined8 *)(this + 0x30) = 0;
    dVar3 = (a._M_current)->row_ep_norm2;
    uVar6 = *(undefined8 *)((long)&(a._M_current)->row_ep_norm2 + 4);
    uVar7 = *(undefined8 *)((long)&(a._M_current)->score + 4);
    *(double *)this = (a._M_current)->fractionality;
    *(double *)(this + 8) = dVar3;
    *(undefined8 *)(this + 0xc) = uVar6;
    *(undefined8 *)(this + 0x14) = uVar7;
    ppVar8 = ((a._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x20) =
         ((a._M_current)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x28) = ppVar8;
    *(pointer *)(this + 0x30) =
         ((a._M_current)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(ulong *)((long)&(a._M_current)->row_ep_norm2 + 4) = CONCAT44(uStack_48,local_4c);
    *(undefined8 *)((long)&(a._M_current)->score + 4) = uVar1;
    (a._M_current)->fractionality = dVar15;
    (a._M_current)->row_ep_norm2 = dVar18;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = ppVar4;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar5;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppVar2;
    lVar9 = (long)(a._M_current)->basisIndex;
    dVar15 = (c._M_current)->fractionality;
    dVar18 = ((1.0 - (a._M_current)->fractionality) * (a._M_current)->fractionality) /
             *(double *)((long)dVar15 + lVar9 * 8);
  }
  dVar3 = ((1.0 - (b._M_current)->fractionality) * (b._M_current)->fractionality) /
          *(double *)((long)dVar15 + (long)(b._M_current)->basisIndex * 8);
  if (dVar3 <= dVar18) {
    if (dVar3 < dVar18) goto LAB_002e9695;
    uVar13 = (long)ppdVar10[3] + lVar9;
    uVar12 = uVar13 & 0xffffffff;
    uVar13 = uVar13 >> 0x20;
    uVar14 = (long)(b._M_current)->basisIndex + (long)ppdVar10[3];
    uVar11 = uVar14 >> 0x20;
    uVar14 = uVar14 & 0xffffffff;
    if (((uVar14 + 0x42d8680e260ae5b) * (uVar11 + 0x8a183895eeac1536) ^
        (uVar11 + 0x80c8963be3e4c2f3) * (uVar14 + 0xc8497d2a400d9551) >> 0x20) <=
        ((uVar12 + 0x42d8680e260ae5b) * (uVar13 + 0x8a183895eeac1536) ^
        (uVar13 + 0x80c8963be3e4c2f3) * (uVar12 + 0xc8497d2a400d9551) >> 0x20)) goto LAB_002e9695;
  }
  dVar15 = (a._M_current)->fractionality;
  dVar18 = (a._M_current)->row_ep_norm2;
  uVar1 = *(undefined8 *)((long)&(a._M_current)->score + 4);
  uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)&(a._M_current)->row_ep_norm2 + 4) >> 0x20);
  local_4c = (undefined4)((ulong)dVar18 >> 0x20);
  ppVar2 = ((a._M_current)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  ppVar4 = ((a._M_current)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ppVar5 = ((a._M_current)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ((a._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((a._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((a._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar3 = (b._M_current)->row_ep_norm2;
  uVar6 = *(undefined8 *)((long)&(b._M_current)->row_ep_norm2 + 4);
  uVar7 = *(undefined8 *)((long)&(b._M_current)->score + 4);
  (a._M_current)->fractionality = (b._M_current)->fractionality;
  (a._M_current)->row_ep_norm2 = dVar3;
  *(undefined8 *)((long)&(a._M_current)->row_ep_norm2 + 4) = uVar6;
  *(undefined8 *)((long)&(a._M_current)->score + 4) = uVar7;
  ppVar8 = ((b._M_current)->row_ep).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  ((a._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       ((b._M_current)->row_ep).
       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  ((a._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVar8;
  ((a._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       ((b._M_current)->row_ep).
       super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  *(ulong *)((long)&(b._M_current)->row_ep_norm2 + 4) = CONCAT44(uStack_48,local_4c);
  *(undefined8 *)((long)&(b._M_current)->score + 4) = uVar1;
  (b._M_current)->fractionality = dVar15;
  (b._M_current)->row_ep_norm2 = dVar18;
  ((b._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = ppVar4;
  ((b._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVar5;
  ((b._M_current)->row_ep).
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppVar2;
  lVar9 = (long)(a._M_current)->basisIndex;
  dVar15 = (c._M_current)->fractionality;
  dVar18 = ((1.0 - (a._M_current)->fractionality) * (a._M_current)->fractionality) /
           *(double *)((long)dVar15 + lVar9 * 8);
LAB_002e9695:
  dVar15 = ((1.0 - *(double *)this) * *(double *)this) /
           *(double *)((long)dVar15 + (long)*(int *)(this + 0x18) * 8);
  if ((dVar15 < dVar18) ||
     ((dVar15 <= dVar18 &&
      (uVar13 = (long)*(int *)(this + 0x18) + (long)ppdVar10[3], uVar14 = uVar13 >> 0x20,
      uVar13 = uVar13 & 0xffffffff, uVar12 = lVar9 + (long)ppdVar10[3], uVar11 = uVar12 >> 0x20,
      uVar12 = uVar12 & 0xffffffff,
      ((uVar13 + 0x42d8680e260ae5b) * (uVar14 + 0x8a183895eeac1536) ^
      (uVar14 + 0x80c8963be3e4c2f3) * (uVar13 + 0xc8497d2a400d9551) >> 0x20) <
      ((uVar12 + 0x42d8680e260ae5b) * (uVar11 + 0x8a183895eeac1536) ^
      (uVar12 + 0xc8497d2a400d9551) * (uVar11 + 0x80c8963be3e4c2f3) >> 0x20))))) {
    dVar15 = *(double *)this;
    dVar18 = *(double *)(this + 8);
    uVar1 = *(undefined8 *)(this + 0x14);
    uStack_48 = (undefined4)((ulong)*(undefined8 *)(this + 0xc) >> 0x20);
    local_4c = (undefined4)((ulong)dVar18 >> 0x20);
    ppVar2 = *(pointer *)(this + 0x30);
    ppVar4 = *(pointer *)(this + 0x20);
    ppVar5 = *(pointer *)(this + 0x28);
    *(undefined8 *)(this + 0x20) = 0;
    *(undefined8 *)(this + 0x28) = 0;
    *(undefined8 *)(this + 0x30) = 0;
    dVar3 = (a._M_current)->row_ep_norm2;
    uVar6 = *(undefined8 *)((long)&(a._M_current)->row_ep_norm2 + 4);
    uVar7 = *(undefined8 *)((long)&(a._M_current)->score + 4);
    *(double *)this = (a._M_current)->fractionality;
    *(double *)(this + 8) = dVar3;
    *(undefined8 *)(this + 0xc) = uVar6;
    *(undefined8 *)(this + 0x14) = uVar7;
    ppVar8 = ((a._M_current)->row_ep).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)(this + 0x20) =
         ((a._M_current)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(this + 0x28) = ppVar8;
    *(pointer *)(this + 0x30) =
         ((a._M_current)->row_ep).
         super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    *(ulong *)((long)&(a._M_current)->row_ep_norm2 + 4) = CONCAT44(uStack_48,local_4c);
    *(undefined8 *)((long)&(a._M_current)->score + 4) = uVar1;
    (a._M_current)->fractionality = dVar15;
    (a._M_current)->row_ep_norm2 = dVar18;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_start = ppVar4;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar5;
    ((a._M_current)->row_ep).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppVar2;
  }
  return;
}

Assistant:

inline void sort3(Iter a, Iter b, Iter c, Compare comp) {
        sort2(a, b, comp);
        sort2(b, c, comp);
        sort2(a, b, comp);
    }